

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

Vector * duckdb::ListVector::GetEntryInternal<duckdb::Vector_const>(Vector *vector)

{
  VectorType VVar1;
  VectorBuffer *pVVar2;
  type pVVar3;
  
  VVar1 = vector->vector_type;
  while (VVar1 == DICTIONARY_VECTOR) {
    DictionaryVector::VerifyDictionary(vector);
    pVVar2 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
    vector = (Vector *)(pVVar2 + 1);
    VVar1 = *(VectorType *)&pVVar2[1]._vptr_VectorBuffer;
  }
  pVVar2 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
  pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                      (pVVar2 + 1));
  return pVVar3;
}

Assistant:

T &ListVector::GetEntryInternal(T &vector) {
	D_ASSERT(vector.GetType().id() == LogicalTypeId::LIST || vector.GetType().id() == LogicalTypeId::MAP);
	if (vector.GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		auto &child = DictionaryVector::Child(vector);
		return ListVector::GetEntry(child);
	}
	D_ASSERT(vector.GetVectorType() == VectorType::FLAT_VECTOR ||
	         vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(vector.auxiliary);
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::LIST_BUFFER);
	return vector.auxiliary->template Cast<VectorListBuffer>().GetChild();
}